

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

void BN_with_flags(BIGNUM *dest,BIGNUM *b,int flags)

{
  int iVar1;
  
  dest->d = b->d;
  iVar1 = b->dmax;
  dest->top = b->top;
  dest->dmax = iVar1;
  dest->neg = b->neg;
  dest->flags = dest->flags & 1U | flags | b->flags & 0xfffffffcU | 2;
  return;
}

Assistant:

void BN_with_flags(BIGNUM *dest, const BIGNUM *b, int flags)
{
    dest->d = b->d;
    dest->top = b->top;
    dest->dmax = b->dmax;
    dest->neg = b->neg;
    dest->flags = ((dest->flags & BN_FLG_MALLOCED)
                   | (b->flags & ~BN_FLG_MALLOCED)
                   | BN_FLG_STATIC_DATA | flags);
}